

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int x509v3_a2i_ipadd(uint8_t *ipout,char *ipasc)

{
  int iVar1;
  char *pcVar2;
  char *ipasc_local;
  uint8_t *ipout_local;
  
  pcVar2 = strchr(ipasc,0x3a);
  if (pcVar2 == (char *)0x0) {
    iVar1 = ipv4_from_asc(ipout,ipasc);
    if (iVar1 == 0) {
      ipout_local._4_4_ = 0;
    }
    else {
      ipout_local._4_4_ = 4;
    }
  }
  else {
    iVar1 = ipv6_from_asc(ipout,ipasc);
    if (iVar1 == 0) {
      ipout_local._4_4_ = 0;
    }
    else {
      ipout_local._4_4_ = 0x10;
    }
  }
  return ipout_local._4_4_;
}

Assistant:

int x509v3_a2i_ipadd(uint8_t ipout[16], const char *ipasc) {
  // If string contains a ':' assume IPv6

  if (strchr(ipasc, ':')) {
    if (!ipv6_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 16;
  } else {
    if (!ipv4_from_asc(ipout, ipasc)) {
      return 0;
    }
    return 4;
  }
}